

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::__cxx11::string::string((string *)&local_68,(string *)fmt_str);
  ::std::__cxx11::string::string((string *)&local_88,(string *)params);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)params_1);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff38,(string *)params_2);
  ::std::__cxx11::string::string((string *)&local_48,(string *)params_3);
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,&local_68,&local_88,&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff38,&local_48,in_stack_ffffffffffffff30);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}